

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  Mat *pMVar1;
  Mat *pMVar2;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined4 uVar20;
  void *ptr;
  void *local_88;
  undefined8 uStack_80;
  size_t local_78;
  int local_70;
  Allocator *local_68;
  undefined4 uStack_60;
  int iStack_5c;
  undefined8 uStack_58;
  size_t sStack_50;
  Mat *local_40;
  void *local_38;
  
  (*mb->_vptr_ModelBin[2])((undefined1 (*) [16])&local_88,mb,(ulong)(uint)this->weight_data_size,0);
  pMVar1 = &this->weight_data;
  if (pMVar1 != (Mat *)&local_88) {
    piVar3 = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (this->weight_data).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->weight_data).data;
        pAVar5 = (this->weight_data).allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (**(code **)(*(long *)pAVar5 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->weight_data).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->weight_data).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->weight_data).refcount = (int *)0x0;
    (this->weight_data).dims = 0;
    (this->weight_data).w = 0;
    (this->weight_data).h = 0;
    (this->weight_data).c = 0;
    (this->weight_data).cstep = 0;
    (this->weight_data).data = local_88;
    (this->weight_data).refcount = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
    (this->weight_data).elemsize = local_78;
    (this->weight_data).elempack = local_70;
    (this->weight_data).allocator = local_68;
    (this->weight_data).dims = uStack_60;
    (this->weight_data).w = iStack_5c;
    (this->weight_data).h = (undefined4)uStack_58;
    (this->weight_data).c = uStack_58._4_4_;
    (this->weight_data).cstep = sStack_50;
  }
  piVar3 = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_68 == (Allocator *)0x0) {
        if (local_88 != (void *)0x0) {
          free(local_88);
        }
      }
      else {
        (**(code **)(*(long *)local_68 + 0x18))();
      }
    }
  }
  if (pMVar1->data == (void *)0x0) {
    return -100;
  }
  if ((long)(this->weight_data).c * (this->weight_data).cstep == 0) {
    return -100;
  }
  if (this->bias_term != 0) {
    (*mb->_vptr_ModelBin[2])((undefined1 (*) [16])&local_88,mb,(ulong)(uint)this->num_output,1);
    pMVar1 = &this->bias_data;
    if (pMVar1 != (Mat *)&local_88) {
      piVar3 = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->bias_data).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->bias_data).data;
          pAVar5 = (this->bias_data).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (**(code **)(*(long *)pAVar5 + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])((long)&(this->bias_data).refcount + 4) = (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      (this->bias_data).dims = 0;
      (this->bias_data).w = 0;
      (this->bias_data).h = 0;
      (this->bias_data).c = 0;
      (this->bias_data).cstep = 0;
      (this->bias_data).data = local_88;
      (this->bias_data).refcount = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
      (this->bias_data).elemsize = local_78;
      (this->bias_data).elempack = local_70;
      (this->bias_data).allocator = local_68;
      (this->bias_data).dims = uStack_60;
      (this->bias_data).w = iStack_5c;
      (this->bias_data).h = (undefined4)uStack_58;
      (this->bias_data).c = uStack_58._4_4_;
      (this->bias_data).cstep = sStack_50;
    }
    piVar3 = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_68 == (Allocator *)0x0) {
          if (local_88 != (void *)0x0) {
            free(local_88);
          }
        }
        else {
          (**(code **)(*(long *)local_68 + 0x18))();
        }
      }
    }
    if (pMVar1->data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  if (this->int8_scale_term == 2) {
    (*mb->_vptr_ModelBin[2])((undefined1 (*) [16])&local_88,mb,1,1);
    pMVar1 = &this->weight_data_int8_scales;
    if (pMVar1 != (Mat *)&local_88) {
      piVar3 = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->weight_data_int8_scales).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->weight_data_int8_scales).data;
          pAVar5 = (this->weight_data_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (**(code **)(*(long *)pAVar5 + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])((long)&(this->weight_data_int8_scales).refcount + 4) =
           (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      (this->weight_data_int8_scales).dims = 0;
      (this->weight_data_int8_scales).w = 0;
      (this->weight_data_int8_scales).h = 0;
      (this->weight_data_int8_scales).c = 0;
      (this->weight_data_int8_scales).cstep = 0;
      (this->weight_data_int8_scales).data = local_88;
      (this->weight_data_int8_scales).refcount =
           (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
      (this->weight_data_int8_scales).elemsize = local_78;
      (this->weight_data_int8_scales).elempack = local_70;
      (this->weight_data_int8_scales).allocator = local_68;
      (this->weight_data_int8_scales).dims = uStack_60;
      (this->weight_data_int8_scales).w = iStack_5c;
      (this->weight_data_int8_scales).h = (undefined4)uStack_58;
      (this->weight_data_int8_scales).c = uStack_58._4_4_;
      (this->weight_data_int8_scales).cstep = sStack_50;
    }
    piVar3 = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_68 == (Allocator *)0x0) {
          if (local_88 != (void *)0x0) {
            free(local_88);
          }
        }
        else {
          (**(code **)(*(long *)local_68 + 0x18))();
        }
      }
    }
    (*mb->_vptr_ModelBin[2])((undefined1 (*) [16])&local_88,mb,1,1);
    pMVar2 = &this->bottom_blob_int8_scales;
    if (pMVar2 != (Mat *)&local_88) {
      piVar3 = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->bottom_blob_int8_scales).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->bottom_blob_int8_scales).data;
          pAVar5 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (**(code **)(*(long *)pAVar5 + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])((long)&(this->bottom_blob_int8_scales).refcount + 4) =
           (undefined1  [16])0x0;
      pMVar2->data = (void *)0x0;
      pMVar2->refcount = (int *)0x0;
      (this->bottom_blob_int8_scales).dims = 0;
      (this->bottom_blob_int8_scales).w = 0;
      (this->bottom_blob_int8_scales).h = 0;
      (this->bottom_blob_int8_scales).c = 0;
      (this->bottom_blob_int8_scales).cstep = 0;
      (this->bottom_blob_int8_scales).data = local_88;
      (this->bottom_blob_int8_scales).refcount =
           (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
      (this->bottom_blob_int8_scales).elemsize = local_78;
      (this->bottom_blob_int8_scales).elempack = local_70;
      (this->bottom_blob_int8_scales).allocator = local_68;
      (this->bottom_blob_int8_scales).dims = uStack_60;
      (this->bottom_blob_int8_scales).w = iStack_5c;
      (this->bottom_blob_int8_scales).h = (undefined4)uStack_58;
      (this->bottom_blob_int8_scales).c = uStack_58._4_4_;
      (this->bottom_blob_int8_scales).cstep = sStack_50;
    }
    piVar3 = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_68 == (Allocator *)0x0) {
          if (local_88 != (void *)0x0) {
            free(local_88);
          }
        }
        else {
          (**(code **)(*(long *)local_68 + 0x18))();
        }
      }
    }
    uVar20 = *(this->weight_data_int8_scales).data;
    iStack_5c = this->group;
    sStack_50 = (size_t)iStack_5c;
    local_88 = (void *)0x0;
    uStack_80._0_4_ = 0;
    uStack_80._4_4_ = 0;
    uStack_80 = (int *)0x0;
    local_78 = 4;
    local_70 = 1;
    local_68 = (Allocator *)0x0;
    uStack_60 = 1;
    uStack_58 = 0x100000001;
    local_40 = pMVar2;
    if (iStack_5c != 0) {
      lVar12 = sStack_50 * 4;
      local_38 = (void *)0x0;
      iVar9 = posix_memalign(&local_38,0x10,sStack_50 * 4 + 4);
      if (iVar9 != 0) {
        local_38 = (void *)0x0;
      }
      local_88 = local_38;
      uStack_80 = (int *)((long)local_38 + lVar12);
      *(undefined4 *)((long)local_38 + lVar12) = 1;
    }
    if (pMVar1 != (Mat *)&local_88) {
      if (uStack_80 != (int *)0x0) {
        LOCK();
        *uStack_80 = *uStack_80 + 1;
        UNLOCK();
      }
      piVar3 = (this->weight_data_int8_scales).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->weight_data_int8_scales).data;
          pAVar5 = (this->weight_data_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (**(code **)(*(long *)pAVar5 + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])((long)&(this->weight_data_int8_scales).refcount + 4) =
           (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      (this->weight_data_int8_scales).dims = 0;
      (this->weight_data_int8_scales).w = 0;
      (this->weight_data_int8_scales).h = 0;
      (this->weight_data_int8_scales).c = 0;
      (this->weight_data_int8_scales).cstep = 0;
      (this->weight_data_int8_scales).data = local_88;
      (this->weight_data_int8_scales).refcount = uStack_80;
      (this->weight_data_int8_scales).elemsize = local_78;
      (this->weight_data_int8_scales).elempack = local_70;
      (this->weight_data_int8_scales).allocator = local_68;
      (this->weight_data_int8_scales).dims = uStack_60;
      (this->weight_data_int8_scales).w = iStack_5c;
      (this->weight_data_int8_scales).h = (undefined4)uStack_58;
      (this->weight_data_int8_scales).c = uStack_58._4_4_;
      (this->weight_data_int8_scales).cstep = sStack_50;
    }
    if (uStack_80 != (int *)0x0) {
      LOCK();
      *uStack_80 = *uStack_80 + -1;
      UNLOCK();
      if (*uStack_80 == 0) {
        if (local_68 == (Allocator *)0x0) {
          if (local_88 != (void *)0x0) {
            free(local_88);
          }
        }
        else {
          (**(code **)(*(long *)local_68 + 0x18))();
        }
      }
    }
    auVar8 = _DAT_00172130;
    auVar7 = _DAT_00171020;
    auVar6 = _DAT_00171010;
    uVar10 = (this->weight_data_int8_scales).c * (int)(this->weight_data_int8_scales).cstep;
    if (0 < (int)uVar10) {
      pvVar4 = pMVar1->data;
      lVar12 = (ulong)uVar10 - 1;
      auVar16._8_4_ = (int)lVar12;
      auVar16._0_8_ = lVar12;
      auVar16._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar11 = 0;
      auVar16 = auVar16 ^ _DAT_00171020;
      do {
        auVar17._8_4_ = (int)uVar11;
        auVar17._0_8_ = uVar11;
        auVar17._12_4_ = (int)(uVar11 >> 0x20);
        auVar19 = (auVar17 | auVar6) ^ auVar7;
        iVar9 = auVar16._4_4_;
        if ((bool)(~(auVar19._4_4_ == iVar9 && auVar16._0_4_ < auVar19._0_4_ ||
                    iVar9 < auVar19._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar4 + uVar11 * 4) = uVar20;
        }
        if ((auVar19._12_4_ != auVar16._12_4_ || auVar19._8_4_ <= auVar16._8_4_) &&
            auVar19._12_4_ <= auVar16._12_4_) {
          *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 4) = uVar20;
        }
        auVar17 = (auVar17 | auVar8) ^ auVar7;
        iVar18 = auVar17._4_4_;
        if (iVar18 <= iVar9 && (iVar18 != iVar9 || auVar17._0_4_ <= auVar16._0_4_)) {
          *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 8) = uVar20;
          *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 0xc) = uVar20;
        }
        uVar11 = uVar11 + 4;
      } while ((uVar10 + 3 & 0xfffffffc) != uVar11);
    }
    uVar20 = *(this->bottom_blob_int8_scales).data;
    iStack_5c = this->group;
    sStack_50 = (size_t)iStack_5c;
    local_88 = (void *)0x0;
    uStack_80._0_4_ = 0;
    uStack_80._4_4_ = 0;
    uStack_80 = (int *)0x0;
    local_78 = 4;
    local_70 = 1;
    local_68 = (Allocator *)0x0;
    uStack_60 = 1;
    uStack_58 = 0x100000001;
    if (iStack_5c != 0) {
      lVar12 = sStack_50 * 4;
      local_38 = (void *)0x0;
      iVar9 = posix_memalign(&local_38,0x10,sStack_50 * 4 + 4);
      if (iVar9 != 0) {
        local_38 = (void *)0x0;
      }
      local_88 = local_38;
      uStack_80 = (int *)((long)local_38 + lVar12);
      *(undefined4 *)((long)local_38 + lVar12) = 1;
    }
    pMVar1 = local_40;
    if (local_40 != (Mat *)&local_88) {
      if (uStack_80 != (int *)0x0) {
        LOCK();
        *uStack_80 = *uStack_80 + 1;
        UNLOCK();
      }
      piVar3 = (this->bottom_blob_int8_scales).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->bottom_blob_int8_scales).data;
          pAVar5 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (**(code **)(*(long *)pAVar5 + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])((long)&pMVar1->refcount + 4) = (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      (this->bottom_blob_int8_scales).dims = 0;
      (this->bottom_blob_int8_scales).w = 0;
      (this->bottom_blob_int8_scales).h = 0;
      (this->bottom_blob_int8_scales).c = 0;
      (this->bottom_blob_int8_scales).cstep = 0;
      (this->bottom_blob_int8_scales).data = local_88;
      (this->bottom_blob_int8_scales).refcount = uStack_80;
      (this->bottom_blob_int8_scales).elemsize = local_78;
      (this->bottom_blob_int8_scales).elempack = local_70;
      (this->bottom_blob_int8_scales).allocator = local_68;
      (this->bottom_blob_int8_scales).dims = uStack_60;
      (this->bottom_blob_int8_scales).w = iStack_5c;
      (this->bottom_blob_int8_scales).h = (undefined4)uStack_58;
      (this->bottom_blob_int8_scales).c = uStack_58._4_4_;
      (this->bottom_blob_int8_scales).cstep = sStack_50;
    }
    if (uStack_80 != (int *)0x0) {
      LOCK();
      *uStack_80 = *uStack_80 + -1;
      UNLOCK();
      if (*uStack_80 == 0) {
        if (local_68 == (Allocator *)0x0) {
          if (local_88 != (void *)0x0) {
            free(local_88);
          }
        }
        else {
          (**(code **)(*(long *)local_68 + 0x18))();
        }
      }
    }
    auVar8 = _DAT_00172130;
    auVar7 = _DAT_00171020;
    auVar6 = _DAT_00171010;
    uVar10 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
    if ((int)uVar10 < 1) {
      return 0;
    }
    pvVar4 = pMVar1->data;
    lVar12 = (ulong)uVar10 - 1;
    auVar19._8_4_ = (int)lVar12;
    auVar19._0_8_ = lVar12;
    auVar19._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar11 = 0;
    auVar19 = auVar19 ^ _DAT_00171020;
    do {
      auVar15._8_4_ = (int)uVar11;
      auVar15._0_8_ = uVar11;
      auVar15._12_4_ = (int)(uVar11 >> 0x20);
      auVar16 = (auVar15 | auVar6) ^ auVar7;
      iVar9 = auVar19._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar9 && auVar19._0_4_ < auVar16._0_4_ || iVar9 < auVar16._4_4_)
                & 1)) {
        *(undefined4 *)((long)pvVar4 + uVar11 * 4) = uVar20;
      }
      if ((auVar16._12_4_ != auVar19._12_4_ || auVar16._8_4_ <= auVar19._8_4_) &&
          auVar16._12_4_ <= auVar19._12_4_) {
        *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 4) = uVar20;
      }
      auVar16 = (auVar15 | auVar8) ^ auVar7;
      iVar18 = auVar16._4_4_;
      if (iVar18 <= iVar9 && (iVar18 != iVar9 || auVar16._0_4_ <= auVar19._0_4_)) {
        *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 8) = uVar20;
        *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 0xc) = uVar20;
      }
      uVar11 = uVar11 + 4;
    } while ((uVar10 + 3 & 0xfffffffc) != uVar11);
  }
  else {
    if (this->int8_scale_term != 1) {
      return 0;
    }
    (*mb->_vptr_ModelBin[2])((undefined1 (*) [16])&local_88,mb,(ulong)(uint)this->group,1);
    pMVar1 = &this->weight_data_int8_scales;
    if (pMVar1 != (Mat *)&local_88) {
      piVar3 = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->weight_data_int8_scales).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->weight_data_int8_scales).data;
          pAVar5 = (this->weight_data_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (**(code **)(*(long *)pAVar5 + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])((long)&(this->weight_data_int8_scales).refcount + 4) =
           (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      (this->weight_data_int8_scales).dims = 0;
      (this->weight_data_int8_scales).w = 0;
      (this->weight_data_int8_scales).h = 0;
      (this->weight_data_int8_scales).c = 0;
      (this->weight_data_int8_scales).cstep = 0;
      (this->weight_data_int8_scales).data = local_88;
      (this->weight_data_int8_scales).refcount =
           (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
      (this->weight_data_int8_scales).elemsize = local_78;
      (this->weight_data_int8_scales).elempack = local_70;
      (this->weight_data_int8_scales).allocator = local_68;
      (this->weight_data_int8_scales).dims = uStack_60;
      (this->weight_data_int8_scales).w = iStack_5c;
      (this->weight_data_int8_scales).h = (undefined4)uStack_58;
      (this->weight_data_int8_scales).c = uStack_58._4_4_;
      (this->weight_data_int8_scales).cstep = sStack_50;
    }
    piVar3 = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_68 == (Allocator *)0x0) {
          if (local_88 != (void *)0x0) {
            free(local_88);
          }
        }
        else {
          (**(code **)(*(long *)local_68 + 0x18))();
        }
      }
    }
    (*mb->_vptr_ModelBin[2])((undefined1 (*) [16])&local_88,mb,1,1);
    pMVar1 = &this->bottom_blob_int8_scales;
    if (pMVar1 != (Mat *)&local_88) {
      piVar3 = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->bottom_blob_int8_scales).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->bottom_blob_int8_scales).data;
          pAVar5 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (**(code **)(*(long *)pAVar5 + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])((long)&(this->bottom_blob_int8_scales).refcount + 4) =
           (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      (this->bottom_blob_int8_scales).dims = 0;
      (this->bottom_blob_int8_scales).w = 0;
      (this->bottom_blob_int8_scales).h = 0;
      (this->bottom_blob_int8_scales).c = 0;
      (this->bottom_blob_int8_scales).cstep = 0;
      (this->bottom_blob_int8_scales).data = local_88;
      (this->bottom_blob_int8_scales).refcount =
           (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
      (this->bottom_blob_int8_scales).elemsize = local_78;
      (this->bottom_blob_int8_scales).elempack = local_70;
      (this->bottom_blob_int8_scales).allocator = local_68;
      (this->bottom_blob_int8_scales).dims = uStack_60;
      (this->bottom_blob_int8_scales).w = iStack_5c;
      (this->bottom_blob_int8_scales).h = (undefined4)uStack_58;
      (this->bottom_blob_int8_scales).c = uStack_58._4_4_;
      (this->bottom_blob_int8_scales).cstep = sStack_50;
    }
    piVar3 = (int *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_68 == (Allocator *)0x0) {
          if (local_88 != (void *)0x0) {
            free(local_88);
          }
        }
        else {
          (**(code **)(*(long *)local_68 + 0x18))();
        }
      }
    }
    uVar20 = *(this->bottom_blob_int8_scales).data;
    iStack_5c = this->group;
    sStack_50 = (size_t)iStack_5c;
    local_88 = (void *)0x0;
    uStack_80._0_4_ = 0;
    uStack_80._4_4_ = 0;
    uStack_80 = (int *)0x0;
    local_78 = 4;
    local_70 = 1;
    local_68 = (Allocator *)0x0;
    uStack_60 = 1;
    uStack_58 = 0x100000001;
    if (iStack_5c != 0) {
      local_40 = (Mat *)CONCAT44(local_40._4_4_,uVar20);
      lVar12 = sStack_50 * 4;
      local_38 = (void *)0x0;
      iVar9 = posix_memalign(&local_38,0x10,sStack_50 * 4 + 4);
      if (iVar9 != 0) {
        local_38 = (void *)0x0;
      }
      local_88 = local_38;
      uStack_80 = (int *)((long)local_38 + lVar12);
      *(undefined4 *)((long)local_38 + lVar12) = 1;
      uVar20 = local_40._0_4_;
    }
    if (pMVar1 != (Mat *)&local_88) {
      if (uStack_80 != (int *)0x0) {
        LOCK();
        *uStack_80 = *uStack_80 + 1;
        UNLOCK();
      }
      piVar3 = (this->bottom_blob_int8_scales).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->bottom_blob_int8_scales).data;
          pAVar5 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar5 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              local_40 = (Mat *)CONCAT44(local_40._4_4_,uVar20);
              free(pvVar4);
              uVar20 = local_40._0_4_;
            }
          }
          else {
            local_40 = (Mat *)CONCAT44(local_40._4_4_,uVar20);
            (**(code **)(*(long *)pAVar5 + 0x18))();
            uVar20 = local_40._0_4_;
          }
        }
      }
      *(undefined1 (*) [16])((long)&(this->bottom_blob_int8_scales).refcount + 4) =
           (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      (this->bottom_blob_int8_scales).dims = 0;
      (this->bottom_blob_int8_scales).w = 0;
      (this->bottom_blob_int8_scales).h = 0;
      (this->bottom_blob_int8_scales).c = 0;
      (this->bottom_blob_int8_scales).cstep = 0;
      (this->bottom_blob_int8_scales).data = local_88;
      (this->bottom_blob_int8_scales).refcount = uStack_80;
      (this->bottom_blob_int8_scales).elemsize = local_78;
      (this->bottom_blob_int8_scales).elempack = local_70;
      (this->bottom_blob_int8_scales).allocator = local_68;
      (this->bottom_blob_int8_scales).dims = uStack_60;
      (this->bottom_blob_int8_scales).w = iStack_5c;
      (this->bottom_blob_int8_scales).h = (undefined4)uStack_58;
      (this->bottom_blob_int8_scales).c = uStack_58._4_4_;
      (this->bottom_blob_int8_scales).cstep = sStack_50;
    }
    local_40._0_4_ = uVar20;
    if (uStack_80 != (int *)0x0) {
      LOCK();
      *uStack_80 = *uStack_80 + -1;
      UNLOCK();
      if (*uStack_80 == 0) {
        if (local_68 == (Allocator *)0x0) {
          if (local_88 != (void *)0x0) {
            local_40 = (Mat *)CONCAT44(local_40._4_4_,uVar20);
            free(local_88);
          }
        }
        else {
          local_40 = (Mat *)CONCAT44(local_40._4_4_,uVar20);
          (**(code **)(*(long *)local_68 + 0x18))();
        }
      }
    }
    auVar8 = _DAT_00172130;
    auVar7 = _DAT_00171020;
    auVar6 = _DAT_00171010;
    uVar10 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
    if ((int)uVar10 < 1) {
      return 0;
    }
    pvVar4 = pMVar1->data;
    lVar12 = (ulong)uVar10 - 1;
    auVar13._8_4_ = (int)lVar12;
    auVar13._0_8_ = lVar12;
    auVar13._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar11 = 0;
    auVar13 = auVar13 ^ _DAT_00171020;
    do {
      auVar14._8_4_ = (int)uVar11;
      auVar14._0_8_ = uVar11;
      auVar14._12_4_ = (int)(uVar11 >> 0x20);
      auVar16 = (auVar14 | auVar6) ^ auVar7;
      iVar9 = auVar13._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar9 && auVar13._0_4_ < auVar16._0_4_ || iVar9 < auVar16._4_4_)
                & 1)) {
        *(undefined4 *)((long)pvVar4 + uVar11 * 4) = local_40._0_4_;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 4) = local_40._0_4_;
      }
      auVar16 = (auVar14 | auVar8) ^ auVar7;
      iVar18 = auVar16._4_4_;
      if (iVar18 <= iVar9 && (iVar18 != iVar9 || auVar16._0_4_ <= auVar13._0_4_)) {
        *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 8) = local_40._0_4_;
        *(undefined4 *)((long)pvVar4 + uVar11 * 4 + 0xc) = local_40._0_4_;
      }
      uVar11 = uVar11 + 4;
    } while ((uVar10 + 3 & 0xfffffffc) != uVar11);
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term == 1)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }
    else if (int8_scale_term == 2)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    return 0;
}